

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xDisassembler.c
# Opt level: O1

void TMS320C64x_init(MCRegisterInfo *MRI)

{
  uint16_t *in_RAX;
  uint unaff_retaddr;
  uint16_t *in_stack_00000008;
  
  MCRegisterInfo_InitMCRegisterInfo
            (MRI,TMS320C64xRegDesc,0x5a,0,0,TMS320C64xMCRegisterClasses,0x699610,
             (uint16_t (*) [2])0x0,0x79fb50,(MCPhysReg *)0x1,(char *)0x0,in_RAX,unaff_retaddr,
             in_stack_00000008);
  return;
}

Assistant:

void TMS320C64x_init(MCRegisterInfo *MRI)
{
	MCRegisterInfo_InitMCRegisterInfo(MRI, TMS320C64xRegDesc, 90,
			0, 0,
			TMS320C64xMCRegisterClasses, 7,
			0, 0,
			TMS320C64xRegDiffLists,
			0,
			TMS320C64xSubRegIdxLists, 1,
			0);
}